

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void run_container_union(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  _Bool _Var4;
  rle16_t *prVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  run_container_t *prVar9;
  ulong uVar10;
  rle16_t local_3c;
  run_container_t *local_38;
  
  _Var3 = run_container_is_full(src_1);
  _Var4 = run_container_is_full(src_2);
  if ((_Var3 || _Var4) && ((prVar9 = src_1, _Var3 || (prVar9 = src_2, _Var4)))) {
    run_container_copy(prVar9,dst);
    return;
  }
  iVar8 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar8) {
    run_container_grow(dst,iVar8,false);
  }
  dst->n_runs = 0;
  uVar1 = src_1->runs->value;
  uVar2 = src_2->runs->value;
  uVar7 = (uint)(uVar1 <= uVar2);
  uVar6 = (ulong)(uVar2 < uVar1);
  prVar5 = src_1->runs;
  if (uVar2 < uVar1) {
    prVar5 = src_2->runs;
  }
  local_3c = *prVar5;
  *dst->runs = local_3c;
  dst->n_runs = dst->n_runs + 1;
  local_38 = dst;
  while( true ) {
    prVar9 = local_38;
    iVar8 = src_2->n_runs;
    uVar10 = (ulong)uVar7;
    if ((iVar8 <= (int)uVar6) || (src_1->n_runs <= (int)uVar7)) break;
    uVar1 = src_1->runs[uVar10].value;
    uVar2 = src_2->runs[uVar6].value;
    prVar5 = src_1->runs + uVar10;
    if (uVar2 < uVar1) {
      prVar5 = src_2->runs + uVar6;
    }
    uVar6 = (ulong)((int)uVar6 + (uint)(uVar2 < uVar1));
    uVar7 = uVar7 + (uVar1 <= uVar2);
    run_container_append(local_38,*prVar5,&local_3c);
  }
  for (; (long)uVar6 < (long)iVar8; uVar6 = uVar6 + 1) {
    run_container_append(prVar9,src_2->runs[uVar6],&local_3c);
    iVar8 = src_2->n_runs;
  }
  for (; (long)uVar10 < (long)src_1->n_runs; uVar10 = uVar10 + 1) {
    run_container_append(prVar9,src_1->runs[uVar10],&local_3c);
  }
  return;
}

Assistant:

void run_container_union(const run_container_t *src_1,
                         const run_container_t *src_2, run_container_t *dst) {
    // TODO: this could be a lot more efficient

    // we start out with inexpensive checks
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            run_container_copy(src_1, dst);
            return;
        }
        if (if2) {
            run_container_copy(src_2, dst);
            return;
        }
    }
    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);
    dst->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;

    rle16_t previousrle;
    if (src_1->runs[rlepos].value <= src_2->runs[xrlepos].value) {
        previousrle = run_container_append_first(dst, src_1->runs[rlepos]);
        rlepos++;
    } else {
        previousrle = run_container_append_first(dst, src_2->runs[xrlepos]);
        xrlepos++;
    }

    while ((xrlepos < src_2->n_runs) && (rlepos < src_1->n_runs)) {
        rle16_t newrl;
        if (src_1->runs[rlepos].value <= src_2->runs[xrlepos].value) {
            newrl = src_1->runs[rlepos];
            rlepos++;
        } else {
            newrl = src_2->runs[xrlepos];
            xrlepos++;
        }
        run_container_append(dst, newrl, &previousrle);
    }
    while (xrlepos < src_2->n_runs) {
        run_container_append(dst, src_2->runs[xrlepos], &previousrle);
        xrlepos++;
    }
    while (rlepos < src_1->n_runs) {
        run_container_append(dst, src_1->runs[rlepos], &previousrle);
        rlepos++;
    }
}